

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

ReaderData * __thiscall BufferedReader::getReader(BufferedReader *this,int readerID)

{
  iterator iVar1;
  ReaderData *pRVar2;
  int local_1c;
  
  local_1c = readerID;
  std::mutex::lock(&this->m_readersMtx);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
          ::find(&(this->m_readers)._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_readers)._M_t._M_impl.super__Rb_tree_header) {
    pRVar2 = (ReaderData *)0x0;
  }
  else {
    pRVar2 = (ReaderData *)iVar1._M_node[1]._M_parent;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  return pRVar2;
}

Assistant:

ReaderData* BufferedReader::getReader(const int readerID)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    return itr != m_readers.end() ? itr->second : nullptr;
}